

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

Vec_Wrd_t * Abc_NtkShareSuperXor(Abc_Obj_t *pObj,int *pfCompl,int *pCounter)

{
  ulong *puVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Wrd_t *p;
  word *pwVar6;
  ulong uVar7;
  ulong uVar8;
  Abc_Obj_t *pAVar9;
  word wVar10;
  word *pwVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar16;
  uint uVar17;
  bool bVar18;
  Abc_Obj_t *pObj0;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *local_60;
  ulong local_58;
  uint *local_50;
  int *local_48;
  Abc_Ntk_t *local_40;
  Abc_Obj_t *local_38;
  uint uVar15;
  
  local_48 = pCounter;
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0x66,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
  }
  local_40 = pObj->pNtk;
  iVar3 = Abc_NodeIsExorType(pObj);
  if (iVar3 == 0) {
    __assert_fail("Abc_NodeIsExorType(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0x67,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
  }
  local_50 = (uint *)pfCompl;
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  pwVar6 = (word *)malloc(0x80);
  p->pArray = pwVar6;
  Vec_WrdPush(p,(ulong)(*(uint *)&pObj->field_0x14 >> 0xc) << 0x20 | (long)pObj->Id);
  uVar5 = p->nSize;
  if ((int)uVar5 < 1) {
    uVar17 = 0;
LAB_00253e3a:
    *local_50 = uVar17;
    iVar3 = p->nSize;
    if (0 < (long)iVar3) {
      pwVar6 = p->pArray;
      lVar13 = 0;
      do {
        pwVar6[lVar13] = (long)(int)pwVar6[lVar13];
        lVar13 = lVar13 + 1;
      } while (iVar3 != lVar13);
    }
    return p;
  }
  uVar12 = 0;
LAB_00253c19:
  uVar8 = (ulong)uVar5;
  pwVar6 = p->pArray;
  if (1 < (int)uVar5) {
    uVar7 = 1;
    wVar10 = *pwVar6;
    do {
      puVar1 = pwVar6 + uVar7;
      if (*puVar1 <= wVar10) {
        __assert_fail("Num < NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                      ,0x71,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
      }
      uVar7 = uVar7 + 1;
      wVar10 = *puVar1;
    } while (uVar8 != uVar7);
  }
  iVar3 = uVar5 + 1;
  uVar7 = uVar8;
  local_58 = uVar12;
  do {
    iVar16 = (int)uVar7;
    wVar10 = pwVar6[iVar16 - 1];
    uVar17 = (uint)wVar10;
    if (((int)uVar17 < 0) || (local_40->vObjs->nSize <= (int)uVar17)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pAVar2 = (Abc_Obj_t *)local_40->vObjs->pArray[uVar17 & 0x7fffffff];
    iVar4 = Abc_NodeIsExorType(pAVar2);
    if (iVar4 != 0) {
      if (*pwVar6 != wVar10) {
        uVar12 = 0;
        goto LAB_00253cb1;
      }
      bVar18 = true;
      uVar8 = 0;
      goto LAB_00253cd1;
    }
    iVar3 = iVar3 + -1;
    uVar7 = uVar7 - 1;
    iVar16 = (int)uVar7;
  } while (1 < iVar3);
  goto LAB_00253d11;
  while (uVar7 = uVar12 + 1, lVar13 = uVar12 + 1, uVar12 = uVar7, pwVar6[lVar13] != wVar10) {
LAB_00253cb1:
    if (uVar8 - 1 == uVar12) {
      bVar18 = false;
      goto LAB_00253cd1;
    }
  }
  bVar18 = uVar7 < uVar8;
  uVar8 = uVar7;
LAB_00253cd1:
  if ((uint)uVar8 != uVar5) {
    if (!bVar18) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x334,"int Vec_WrdRemove(Vec_Wrd_t *, word)");
    }
    uVar17 = (uint)uVar8 + 1;
    if ((int)uVar17 < (int)uVar5) {
      pwVar11 = pwVar6 + uVar17;
      do {
        iVar3 = (int)uVar8;
        pwVar6[uVar8 & 0xffffffff] = *pwVar11;
        uVar8 = (ulong)(iVar3 + 1);
        pwVar11 = pwVar11 + 1;
      } while (iVar3 + 2 < (int)uVar5);
    }
    p->nSize = uVar5 - 1;
  }
LAB_00253d11:
  if (iVar16 == 0) {
    uVar17 = (uint)local_58;
    goto LAB_00253e3a;
  }
  pAVar9 = Abc_NodeRecognizeMux(pAVar2,&local_38,&local_60);
  pAVar2 = local_60;
  if (local_38 != (Abc_Obj_t *)((ulong)local_60 ^ 1)) {
    __assert_fail("pObj1 == Abc_ObjNot(pObj0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0x82,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
  }
  local_60 = (Abc_Obj_t *)((ulong)local_60 & 0xfffffffffffffffe);
  Vec_WrdPushOrder(p,(ulong)(*(uint *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x14) >> 0xc) << 0x20
                     | (long)*(int *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x10));
  Vec_WrdPushOrder(p,(ulong)(*(uint *)&local_60->field_0x14 >> 0xc) << 0x20 | (long)local_60->Id);
  *local_48 = *local_48 + 1;
  uVar17 = p->nSize;
  if ((int)uVar17 < 1) {
    uVar5 = 0;
  }
  else {
    pwVar6 = p->pArray;
    uVar5 = 0;
    uVar14 = 0;
    do {
      if ((int)uVar14 < 0) {
LAB_00253e92:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      uVar12 = pwVar6[uVar14];
      uVar15 = uVar14 + 1;
      if (uVar15 == uVar17) {
        if (uVar17 <= uVar5) {
LAB_00253eef:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        uVar8 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        pwVar6[uVar8] = uVar12;
        break;
      }
      if ((int)uVar17 <= (int)uVar15) goto LAB_00253e92;
      if (pwVar6[uVar15] < uVar12) {
        __assert_fail("Num <= NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                      ,0x92,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
      }
      if (uVar12 != pwVar6[uVar15]) {
        if (uVar17 <= uVar5) goto LAB_00253eef;
        uVar8 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        pwVar6[uVar8] = uVar12;
        uVar15 = uVar14;
      }
      uVar14 = uVar15 + 1;
    } while ((int)uVar14 < (int)uVar17);
  }
  if ((int)uVar17 < (int)uVar5) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                  ,0x255,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
  }
  uVar17 = ((uint)pAVar2 ^ (uint)pAVar9) & 1 ^ (uint)local_58;
  uVar12 = (ulong)uVar17;
  p->nSize = uVar5;
  if ((int)uVar5 < 1) goto LAB_00253e3a;
  goto LAB_00253c19;
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperXor( Abc_Obj_t * pObj, int * pfCompl, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObjC, * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k, fCompl = 0;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( Abc_NodeIsExorType(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjId(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract XOR gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_NtkObj( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( Abc_NodeIsExorType(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        // extract
        pObjC = Abc_NodeRecognizeMux( pRoot, &pObj1, &pObj0 );
        assert( pObj1 == Abc_ObjNot(pObj0) );
        fCompl ^= Abc_ObjIsComplement(pObjC);  pObjC = Abc_ObjRegular(pObjC);
        fCompl ^= Abc_ObjIsComplement(pObj0);  pObj0 = Abc_ObjRegular(pObj0);
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObjC), Abc_ObjId(pObjC)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj0), Abc_ObjId(pObj0)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num == NumNext )
                i++;
            else
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    *pfCompl = fCompl;
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}